

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_ratio(REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio)

{
  REF_DBL *pRVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  REF_DBL m [6];
  double local_78 [6];
  double local_48;
  undefined8 uStack_40;
  
  if (((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->max <= node1)) ||
      ((node1 < 0 || (ref_node->global[(uint)node0] < 0)))) || (ref_node->global[(uint)node1] < 0))
  {
    pcVar7 = "node invalid";
    uVar3 = 3;
    uVar5 = 0x57b;
    uVar6 = 3;
LAB_0012e4c9:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
           "ref_node_ratio",uVar6,pcVar7);
    return uVar3;
  }
  pRVar1 = ref_node->real;
  uVar3 = node1 * 0xf;
  uVar2 = node0 * 0xf;
  dVar13 = pRVar1[uVar3] - pRVar1[uVar2];
  dVar12 = pRVar1[(ulong)uVar3 + 1] - pRVar1[(ulong)uVar2 + 1];
  dVar11 = pRVar1[(ulong)uVar3 + 2] - pRVar1[(ulong)uVar2 + 2];
  dVar8 = dVar11 * dVar11 + dVar13 * dVar13 + dVar12 * dVar12;
  if (dVar8 < 0.0) {
    uStack_40 = 0;
    local_48 = dVar13;
    dVar8 = sqrt(dVar8);
    dVar13 = local_48;
    uVar5 = uStack_40;
  }
  else {
    dVar8 = SQRT(dVar8);
    uVar5 = 0;
  }
  dVar8 = dVar8 * 1e+20;
  if (dVar8 <= -dVar8) {
    dVar8 = -dVar8;
  }
  dVar9 = dVar13;
  if (dVar13 <= -dVar13) {
    dVar9 = -dVar13;
  }
  if (dVar9 < dVar8) {
    dVar9 = dVar12;
    if (dVar12 <= -dVar12) {
      dVar9 = -dVar12;
    }
    if (dVar9 < dVar8) {
      dVar9 = dVar11;
      if (dVar11 <= -dVar11) {
        dVar9 = -dVar11;
      }
      if (dVar9 < dVar8) {
        if (ref_node->ratio_method != 2) {
          pRVar1 = ref_node->real;
          lVar4 = 0;
          do {
            local_78[lVar4] = pRVar1[(int)((int)lVar4 + uVar2 + 3)];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 6);
          dVar8 = (local_78[5] * dVar11 + local_78[2] * dVar13 + local_78[4] * dVar12) * dVar11 +
                  (local_78[2] * dVar11 + local_78[0] * dVar13 + dVar12 * local_78[1]) * dVar13 +
                  (local_78[4] * dVar11 + local_78[1] * dVar13 + local_78[3] * dVar12) * dVar12;
          if (dVar8 < 0.0) {
            local_48 = dVar13;
            uStack_40 = uVar5;
            dVar8 = sqrt(dVar8);
            dVar13 = local_48;
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          pRVar1 = ref_node->real;
          lVar4 = 0;
          do {
            local_78[lVar4] = pRVar1[(int)((int)lVar4 + uVar3 + 3)];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 6);
          dVar13 = (local_78[5] * dVar11 + local_78[2] * dVar13 + dVar12 * local_78[4]) * dVar11 +
                   (local_78[2] * dVar11 + local_78[0] * dVar13 + dVar12 * local_78[1]) * dVar13 +
                   (local_78[4] * dVar11 + local_78[1] * dVar13 + local_78[3] * dVar12) * dVar12;
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          dVar11 = dVar8;
          if (dVar13 <= dVar8) {
            dVar11 = dVar13;
          }
          if ((1e-12 <= dVar8) && (1e-12 <= dVar13)) {
            dVar12 = dVar8;
            if (dVar8 <= dVar13) {
              dVar12 = dVar13;
            }
            dVar12 = dVar11 / dVar12;
            dVar10 = dVar12 + -1.0;
            dVar9 = dVar10;
            if (dVar10 <= -dVar10) {
              dVar9 = -dVar10;
            }
            if (dVar9 < 1e-12) {
              *ratio = (dVar8 + dVar13) * 0.5;
              return 0;
            }
            dVar8 = log(dVar12);
            *ratio = (dVar11 * dVar10) / (dVar8 * dVar12);
            return 0;
          }
          *ratio = dVar11;
          return 0;
        }
        uVar3 = ref_node_ratio_log_quadrature(ref_node,node0,node1,ratio);
        if (uVar3 == 0) {
          return 0;
        }
        pcVar7 = "ratio";
        uVar5 = 0x58f;
        uVar6 = (ulong)uVar3;
        goto LAB_0012e4c9;
      }
    }
  }
  *ratio = 0.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_ratio(REF_NODE ref_node, REF_INT node0,
                                  REF_INT node1, REF_DBL *ratio) {
  REF_DBL direction[3], length;
  REF_DBL ratio0, ratio1;
  REF_DBL r, r_min, r_max;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio = 0.0;
    return REF_SUCCESS;
  }

  if (REF_NODE_RATIO_QUADRATURE == ref_node->ratio_method) {
    RSS(ref_node_ratio_log_quadrature(ref_node, node0, node1, ratio), "ratio");
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  ratio0 = ref_matrix_sqrt_vt_m_v(m, direction);
  RSS(ref_node_metric_get(ref_node, node1, m), "node1 m");
  ratio1 = ref_matrix_sqrt_vt_m_v(m, direction);

  /* Loseille Lohner IMR 18 (2009) pg 613 */
  /* Alauzet Finite Elements in Analysis and Design 46 (2010) pg 185 */

  if (ratio0 < 1.0e-12 || ratio1 < 1.0e-12) {
    *ratio = MIN(ratio0, ratio1);
    return REF_SUCCESS;
  }

  r_min = MIN(ratio0, ratio1);
  r_max = MAX(ratio0, ratio1);

  r = r_min / r_max;

  if (ABS(r - 1.0) < 1.0e-12) {
    *ratio = 0.5 * (ratio0 + ratio1);
    return REF_SUCCESS;
  }

  *ratio = r_min * (r - 1.0) / (r * log(r));

  return REF_SUCCESS;
}